

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AudioStream.c
# Opt level: O1

UINT8 Audio_Deinit(void)

{
  ADRV_LIST *__ptr;
  ADRV_LIST *pAVar1;
  ADRV_INSTANCE *pAVar2;
  UINT8 UVar3;
  long lVar4;
  ulong uVar5;
  bool bVar6;
  
  UVar3 = '\x18';
  if (isInit == '\x01') {
    if (runDevCount == '\x01') {
      uVar5 = 0;
      do {
        pAVar2 = runDevices;
        if (runDevices[uVar5].ID != 0xffffffff) {
          (*(runDevices[uVar5].drvStruct)->Stop)(runDevices[uVar5].drvData);
          (*(pAVar2[uVar5].drvStruct)->Destroy)(pAVar2[uVar5].drvData);
          __ptr = pAVar2[uVar5].forwardDrvs;
          pAVar2[uVar5].forwardDrvs = (ADRV_LIST *)0x0;
          while (__ptr != (ADRV_LIST *)0x0) {
            pAVar1 = __ptr->next;
            free(__ptr);
            __ptr = pAVar1;
          }
        }
      } while ((runDevCount == '\x01') && (bVar6 = uVar5 < 0xf, uVar5 = uVar5 + 1, bVar6));
    }
    if (audDrvCount != 0) {
      lVar4 = 8;
      uVar5 = 0;
      do {
        if ((*(byte *)((long)audDrvLoaded + lVar4 + -8) & 2) != 0) {
          (**(code **)(*(long *)(&audDrvLoaded->flags + lVar4) + 0x20))();
        }
        uVar5 = uVar5 + 1;
        lVar4 = lVar4 + 0x10;
      } while (uVar5 < audDrvCount);
    }
    free(runDevices);
    UVar3 = '\0';
    runDevices = (ADRV_INSTANCE *)0x0;
    runDevCount = '\0';
    free(audDrvLoaded);
    audDrvLoaded = (ADRV_LOAD *)0x0;
    audDrvCount = 0;
    isInit = '\0';
  }
  return UVar3;
}

Assistant:

UINT8 Audio_Deinit(void)
{
	UINT32 curDev;
	ADRV_INSTANCE* tempAIns;
	
	if (! isInit)
		return AERR_WASDONE;
	
	for (curDev = 0; curDev < runDevCount; curDev ++)
	{
		tempAIns = &runDevices[curDev];
		if (tempAIns->ID != ADID_UNUSED)
		{
			tempAIns->drvStruct->Stop(tempAIns->drvData);
			tempAIns->drvStruct->Destroy(tempAIns->drvData);
			ADrvLst_Clear(&tempAIns->forwardDrvs);
		}
	}
	for (curDev = 0; curDev < audDrvCount; curDev ++)
	{
		if (audDrvLoaded[curDev].flags & ADFLG_IS_INIT)
			audDrvLoaded[curDev].drvStruct->Deinit();
	}
	
	free(runDevices);	runDevices = NULL;
	runDevCount = 0;
	free(audDrvLoaded);	audDrvLoaded = NULL;
	audDrvCount = 0;
	
	isInit = false;
	return AERR_OK;
}